

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::SGDOptimizer::SharedDtor(SGDOptimizer *this)

{
  SGDOptimizer *pSVar1;
  SGDOptimizer *this_local;
  
  pSVar1 = internal_default_instance();
  if ((this != pSVar1) && (this->learningrate_ != (DoubleParameter *)0x0)) {
    (*(this->learningrate_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pSVar1 = internal_default_instance();
  if ((this != pSVar1) && (this->minibatchsize_ != (Int64Parameter *)0x0)) {
    (*(this->minibatchsize_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pSVar1 = internal_default_instance();
  if ((this != pSVar1) && (this->momentum_ != (DoubleParameter *)0x0)) {
    (*(this->momentum_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void SGDOptimizer::SharedDtor() {
  if (this != internal_default_instance()) {
    delete learningrate_;
  }
  if (this != internal_default_instance()) {
    delete minibatchsize_;
  }
  if (this != internal_default_instance()) {
    delete momentum_;
  }
}